

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O1

void __thiscall RGBSpectrum_RoundTripsRGB_Test::TestBody(RGBSpectrum_RoundTripsRGB_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  RGBColorSpace *cs;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  bool bVar5;
  uint64_t oldstate;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_register_00001304 [12];
  XYZ XVar25;
  RGB RVar26;
  Float eps;
  AssertionResult gtest_ar;
  DenselySampledSpectrum rsIllum;
  RGBReflectanceSpectrum rs;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_108;
  float local_e4;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  RGB local_d0;
  RGB local_c0;
  uint local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  undefined8 local_90;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_88;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_68;
  SpectrumHandle local_60;
  XYZ local_58;
  RGBReflectanceSpectrum local_4c;
  
  cs = pbrt::RGBColorSpace::sRGB;
  local_68.bits = (ulong)&local_90 | 0x2000000000000;
  uVar6 = 0x853c49e6748fea9b;
  iVar14 = 0;
  do {
    uVar9 = uVar6 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar10 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar8 = (byte)(uVar10 >> 0x3b);
    auVar16 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar11 >> bVar8 | uVar11 << 0x20 - bVar8);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar9;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar6;
    auVar19 = vpunpcklqdq_avx(auVar24,auVar18);
    auVar15 = vpsrlvq_avx2(auVar19,_DAT_005c85b0);
    auVar18 = vpsrlvq_avx2(auVar19,_DAT_005c85c0);
    in_ZMM3 = ZEXT1664(auVar18);
    auVar15 = vpshufd_avx(auVar15 ^ auVar18,0xe8);
    auVar19 = vpsrlq_avx(auVar19,0x3b);
    auVar19 = vpshufd_avx(auVar19,0xe8);
    auVar15 = vprorvd_avx512vl(auVar15,auVar19);
    auVar19 = vcvtudq2ps_avx512vl(auVar15);
    auVar15._8_4_ = 0x2f800000;
    auVar15._0_8_ = 0x2f8000002f800000;
    auVar15._12_4_ = 0x2f800000;
    auVar15 = vmulps_avx512vl(auVar19,auVar15);
    auVar19._8_4_ = 0x3f7fffff;
    auVar19._0_8_ = 0x3f7fffff3f7fffff;
    auVar19._12_4_ = 0x3f7fffff;
    auVar15 = vminps_avx512vl(auVar15,auVar19);
    local_d0._0_8_ = vmovlps_avx(auVar15);
    local_d0.b = auVar16._0_4_;
    pbrt::RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_4c,cs,&local_d0);
    local_88.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_90 = 0x33e00000168;
    local_88.ptr = (float *)0x0;
    local_88.nAlloc = 0;
    local_88.nStored = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_88,0x1d7);
    memset(local_88.ptr,0,0x75c);
    local_88.nStored = 0x1d7;
    lVar13 = 0;
    do {
      auVar23._0_4_ = (float)((int)lVar13 + 0x168);
      auVar23._4_12_ = in_register_00001304;
      local_ac = local_4c.scale;
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)local_4c.rsp.c0),auVar23,
                                ZEXT416((uint)local_4c.rsp.c1));
      auVar16 = vfmadd213ss_fma(auVar16,auVar23,ZEXT416((uint)local_4c.rsp.c2));
      if ((auVar16._0_4_ & 0x7fffffff) == 0x7f800000) {
        uVar1 = vcmpss_avx512f(auVar16,ZEXT416(0),0xe);
        fVar17 = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
      }
      else {
        auVar15 = vfmadd213ss_fma(auVar16,auVar16,ZEXT416(0x3f800000));
        if (auVar15._0_4_ < 0.0) {
          local_a8._0_4_ = auVar23._0_4_;
          local_b0 = auVar16._0_4_;
          fVar17 = sqrtf(auVar15._0_4_);
          auVar16 = ZEXT416(local_b0);
          auVar23 = ZEXT416((uint)local_a8._0_4_);
        }
        else {
          auVar15 = vsqrtss_avx(auVar15,auVar15);
          fVar17 = auVar15._0_4_;
        }
        fVar17 = auVar16._0_4_ / (fVar17 + fVar17) + 0.5;
      }
      local_a8 = ZEXT416((uint)fVar17);
      lVar7 = lroundf(auVar23._0_4_);
      uVar11 = (int)lVar7 - (cs->illuminant).lambda_min;
      fVar17 = 0.0;
      if ((-1 < (int)uVar11) && ((ulong)uVar11 < (cs->illuminant).values.nStored)) {
        fVar17 = (cs->illuminant).values.ptr[uVar11];
      }
      auVar22 = (undefined1  [56])0x0;
      local_88.ptr[lVar13] = (float)local_a8._0_4_ * local_ac * fVar17;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x1d7);
    local_60.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )local_68.bits;
    XVar25 = pbrt::SpectrumToXYZ(&local_60);
    local_58.Z = XVar25.Z;
    auVar20._0_8_ = XVar25._0_8_;
    auVar20._8_56_ = auVar22;
    local_58._0_8_ = vmovlps_avx(auVar20._0_16_);
    RVar26 = pbrt::RGBColorSpace::ToRGB(cs,&local_58);
    local_c0.b = RVar26.b;
    auVar21._0_8_ = RVar26._0_8_;
    auVar21._8_56_ = auVar22;
    local_c0._0_8_ = vmovlps_avx(auVar21._0_16_);
    local_e4 = 0.01;
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(ZEXT416((uint)(local_d0.r - local_c0.r)),auVar16);
    local_108._M_dataplus._M_p._0_4_ = auVar16._0_4_;
    testing::internal::CmpHelperLT<float,float>
              (local_e0,"std::abs(rgb.r - rgb2.r)","eps",(float *)&local_108,&local_e4);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      sVar4.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar4.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110.ptr_ + 0x10)," vs ",4);
      sVar4.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar4.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar12 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x75,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_110.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110.ptr_ + 8))();
        }
        local_110.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(ZEXT416((uint)(local_d0.g - local_c0.g)),auVar2);
    local_108._M_dataplus._M_p._0_4_ = auVar16._0_4_;
    testing::internal::CmpHelperLT<float,float>
              (local_e0,"std::abs(rgb.g - rgb2.g)","eps",(float *)&local_108,&local_e4);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      sVar4.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar4.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110.ptr_ + 0x10)," vs ",4);
      sVar4.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar4.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar12 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x76,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_110.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110.ptr_ + 8))();
        }
        local_110.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(ZEXT416((uint)(local_d0.b - local_c0.b)),auVar3);
    local_108._M_dataplus._M_p._0_4_ = auVar16._0_4_;
    testing::internal::CmpHelperLT<float,float>
              (local_e0,"std::abs(rgb.b - rgb2.b)","eps",(float *)&local_108,&local_e4);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      sVar4.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar4.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110.ptr_ + 0x10)," vs ",4);
      sVar4.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar4.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar12 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x77,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_110.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110.ptr_ + 8))();
        }
        local_110.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_88.nStored = 0;
    (*(local_88.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_88.alloc.memoryResource,local_88.ptr,local_88.nAlloc << 2,4);
    uVar6 = uVar10 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    iVar14 = iVar14 + 1;
  } while (iVar14 != 100);
  return;
}

Assistant:

TEST(RGBSpectrum, RoundTripsRGB) {
    RNG rng;
    const RGBColorSpace &cs = *RGBColorSpace::sRGB;

    for (int i = 0; i < 100; ++i) {
        RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
        RGBReflectanceSpectrum rs(cs, rgb);

        DenselySampledSpectrum rsIllum = DenselySampledSpectrum::SampleFunction(
            [&](Float lambda) { return rs(lambda) * cs.illuminant(lambda); });
        XYZ xyz = SpectrumToXYZ(&rsIllum);
        RGB rgb2 = cs.ToRGB(xyz);

        // Some error comes from the fact that piecewise linear (at 5nm)
        // CIE curves were used for the optimization while we use piecewise
        // linear at 1nm spacing converted to 1nm constant / densely
        // sampled.
        Float eps = .01;
        EXPECT_LT(std::abs(rgb.r - rgb2.r), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.g - rgb2.g), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.b - rgb2.b), eps) << rgb << " vs " << rgb2;
    }
}